

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O3

int Gia_ManHashXor(Gia_Man_t *p,int iLit0,int iLit1)

{
  int iVar1;
  int iLit1_00;
  uint uVar2;
  uint uVar3;
  
  if (p->fGiaSimple == 0) {
    if ((iLit0 < 0) || (iLit1 < 0)) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x130,"int Abc_LitIsCompl(int)");
    }
    uVar2 = Gia_ManHashAnd(p,iLit0 & 0x7ffffffe,iLit1 | 1);
    uVar3 = Gia_ManHashAnd(p,iLit1 & 0x7ffffffe,iLit0 | 1);
    if ((-1 < (int)uVar2) && (-1 < (int)uVar3)) {
      uVar2 = Gia_ManHashAnd(p,uVar2 ^ 1,uVar3 ^ 1);
      if (-1 < (int)uVar2) {
        return (iLit1 ^ iLit0) & 1U ^ uVar2 ^ 1;
      }
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x132,"int Abc_LitNotCond(int, int)");
    }
  }
  else if (-1 < iLit1) {
    iVar1 = Gia_ManHashAnd(p,iLit0,iLit1 ^ 1);
    if (-1 < iLit0) {
      iLit1_00 = Gia_ManHashAnd(p,iLit0 ^ 1,iLit1);
      iVar1 = Gia_ManHashOr(p,iVar1,iLit1_00);
      return iVar1;
    }
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                ,0x131,"int Abc_LitNot(int)");
}

Assistant:

int Gia_ManHashXor( Gia_Man_t * p, int iLit0, int iLit1 )  
{ 
    if ( p->fGiaSimple )
        return Gia_ManHashOr(p, Gia_ManHashAnd(p, iLit0, Abc_LitNot(iLit1)), Gia_ManHashAnd(p, Abc_LitNot(iLit0), iLit1) );
    else
    {
        int fCompl = Abc_LitIsCompl(iLit0) ^ Abc_LitIsCompl(iLit1);
        int iTemp0 = Gia_ManHashAnd( p, Abc_LitRegular(iLit0), Abc_LitNot(Abc_LitRegular(iLit1)) );
        int iTemp1 = Gia_ManHashAnd( p, Abc_LitRegular(iLit1), Abc_LitNot(Abc_LitRegular(iLit0)) );
        return Abc_LitNotCond( Gia_ManHashAnd( p, Abc_LitNot(iTemp0), Abc_LitNot(iTemp1) ), !fCompl );
    }
}